

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void kratos::fix_verilog_ln(Generator *generator,uint32_t offset)

{
  uint32_t *puVar1;
  size_type *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_name;
  Generator *pGVar3;
  undefined1 local_c0 [8];
  unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
  stmts;
  StatementGraph graph;
  Generator *local_40;
  
  if (generator->debug == true) {
    puVar1 = &(generator->super_IRNode).verilog_ln;
    *puVar1 = *puVar1 + offset;
    Generator::get_all_var_names_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&graph.root_,generator);
    for (pGVar3 = graph.root_; pGVar3 != local_40;
        pGVar3 = (Generator *)&(pGVar3->super_IRNode).verilog_ln) {
      Generator::get_var((Generator *)&stmts._M_h._M_single_bucket,(string *)generator);
      *(uint32_t *)&stmts._M_h._M_single_bucket[4]._M_nxt =
           *(int *)&stmts._M_h._M_single_bucket[4]._M_nxt + offset;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&graph);
    }
    StatementGraph::StatementGraph((StatementGraph *)&stmts._M_h._M_single_bucket,generator);
    std::
    _Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable((_Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)local_c0,
                 (_Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)&stmts._M_h._M_single_bucket);
    psVar2 = &stmts._M_h._M_bucket_count;
    while (psVar2 = (size_type *)*psVar2, psVar2 != (size_type *)0x0) {
      *(uint32_t *)&((__node_base *)(psVar2 + 1))->_M_nxt[4]._M_nxt =
           *(int *)&((__node_base *)(psVar2 + 1))->_M_nxt[4]._M_nxt + offset;
    }
    std::
    _Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_c0);
    std::
    _Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&stmts._M_h._M_single_bucket);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&graph.root_);
  }
  return;
}

Assistant:

void fix_verilog_ln(Generator* generator, uint32_t offset) {
    // need to fix every variable and statement verilog line number by an offset
    if (!generator->debug) return;
    // fix the variable declaration
    generator->verilog_ln += offset;
    auto const& var_names = generator->get_all_var_names();
    for (auto const& var_name : var_names) {
        auto var = generator->get_var(var_name);
        var->verilog_ln += offset;
    }
    // get all the statement graph
    StatementGraph graph(generator);
    auto stmts = graph.nodes();
    for (auto const& iter : stmts) {
        auto* stmt = iter.first;
        stmt->verilog_ln += offset;
    }
}